

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.h
# Opt level: O0

uint __thiscall bhf::Commandline::Pop<unsigned_int>(Commandline *this,string *errorMessage)

{
  char **ppcVar1;
  char *pcVar2;
  ulong uVar3;
  allocator local_41;
  string local_40 [32];
  string *local_20;
  string *errorMessage_local;
  Commandline *this_local;
  
  local_20 = errorMessage;
  errorMessage_local = (string *)this;
  if (this->argc == 0) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&this->usage,local_20);
    }
    this_local._4_4_ = 0;
  }
  else {
    this->argc = this->argc + -1;
    ppcVar1 = this->argv;
    this->argv = ppcVar1 + 1;
    pcVar2 = *ppcVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar2,&local_41);
    this_local._4_4_ = StringTo<unsigned_int>((string *)local_40,0);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return this_local._4_4_;
}

Assistant:

T Pop(const std::string& errorMessage = {})
    {
        if (argc) {
            --argc;
            return StringTo<T>(*(argv++));
        }
        if (!errorMessage.empty()) {
            usage(errorMessage);
        }
        return T {};
    }